

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

void __thiscall QBuffer::QBuffer(QBuffer *this,QObject *parent)

{
  QBufferPrivate *pQVar1;
  undefined8 *in_RDI;
  QBufferPrivate *d;
  QIODevicePrivate *in_stack_ffffffffffffffd8;
  QIODevice *in_stack_ffffffffffffffe0;
  
  pQVar1 = (QBufferPrivate *)operator_new(0x1b8);
  QBufferPrivate::QBufferPrivate(pQVar1);
  QIODevice::QIODevice(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(QObject *)pQVar1);
  *in_RDI = &PTR_metaObject_00be26e0;
  pQVar1 = d_func((QBuffer *)0x273991);
  pQVar1->buf = &pQVar1->defaultBuf;
  return;
}

Assistant:

QBuffer::QBuffer(QObject *parent)
    : QIODevice(*new QBufferPrivate, parent)
{
    Q_D(QBuffer);
    d->buf = &d->defaultBuf;
}